

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  float fVar2;
  float fVar3;
  ThreadLocal2 *this_00;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  size_t i;
  ulong uVar10;
  size_t sVar11;
  undefined1 *puVar12;
  ulong uVar13;
  long lVar14;
  PrimRef *pPVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  unsigned_long uVar19;
  vuint<4> v0;
  vuint<4> geomID;
  vuint<4> v1;
  vuint<4> v2;
  float local_48 [6];
  
  uVar10 = range->_begin;
  puVar12 = (undefined1 *)((long)&prims[uVar10].lower.field_0 + 0xc);
  for (; uVar10 < range->_end; uVar10 = uVar10 + 1) {
    puVar12[3] = puVar12[3] & 7;
    puVar12 = puVar12 + 0x20;
  }
  uVar19 = range->_begin;
  uVar10 = (range->_end - uVar19) + 3 >> 2;
  geomID.field_0.v[0] = uVar10 * 0x50;
  this_00 = (alloc.talloc1)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    v0.field_0.v[1]._0_1_ = 1;
    v2.field_0.v[0] = (longlong)this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  uVar7 = geomID.field_0.v[0];
  (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + geomID.field_0.v[0];
  sVar11 = (alloc.talloc1)->cur;
  uVar13 = (ulong)(-(int)sVar11 & 0xf);
  uVar8 = sVar11 + geomID.field_0.v[0] + uVar13;
  (alloc.talloc1)->cur = uVar8;
  if ((alloc.talloc1)->end < uVar8) {
    (alloc.talloc1)->cur = sVar11;
    uVar8 = (alloc.talloc1)->allocBlockSize;
    if ((ulong)(geomID.field_0.v[0] * 4) < uVar8 || geomID.field_0.v[0] * 4 - uVar8 == 0) {
      v0.field_0.v[0] = uVar8;
      pcVar9 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc1)->ptr = pcVar9;
      sVar11 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar11;
      (alloc.talloc1)->end = v0.field_0.v[0];
      (alloc.talloc1)->cur = uVar7;
      if ((ulong)v0.field_0.v[0] < (ulong)uVar7) {
        (alloc.talloc1)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
        pcVar9 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc1)->ptr = pcVar9;
        sVar11 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar11;
        (alloc.talloc1)->end = v0.field_0.v[0];
        (alloc.talloc1)->cur = uVar7;
        if ((ulong)v0.field_0.v[0] < (ulong)uVar7) {
          (alloc.talloc1)->cur = 0;
          pcVar9 = (char *)0x0;
        }
        else {
          (alloc.talloc1)->bytesWasted = sVar11;
        }
      }
      else {
        (alloc.talloc1)->bytesWasted = sVar11;
      }
    }
    else {
      pcVar9 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar13;
    pcVar9 = (alloc.talloc1)->ptr + (uVar8 - geomID.field_0._0_8_);
  }
  for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
    uVar13 = range->_end;
    lVar14 = *(long *)(*(long *)this + 0x68);
    v0.field_0.v[0] = 0;
    v0.field_0.v[1] = 0;
    v1.field_0.v[0] = 0;
    v1.field_0.v[1] = 0;
    v2.field_0.v[0] = 0;
    v2.field_0.v[1] = 0;
    geomID.field_0.v[0] = -1;
    geomID.field_0.i[2] = 0xffffffff;
    geomID.field_0.i[3] = 0xffffffff;
    local_48[0] = -NAN;
    local_48[1] = -NAN;
    local_48[2] = -NAN;
    local_48[3] = -NAN;
    pPVar15 = prims + uVar19;
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 4) {
      if (uVar19 < uVar13) {
        fVar2 = (pPVar15->lower).field_0.m128[3];
        *(float *)((long)&geomID.field_0 + lVar16) = fVar2;
        fVar3 = (pPVar15->upper).field_0.m128[3];
        *(float *)((long)local_48 + lVar16) = fVar3;
        lVar4 = *(long *)(*(long *)(lVar14 + 0x1e8) + (ulong)(uint)fVar2 * 8);
        lVar5 = *(long *)(lVar4 + 0x58);
        lVar18 = (ulong)(uint)fVar3 * *(long *)(lVar4 + 0x68);
        uVar17 = *(uint *)(lVar4 + 0xa0) >> 2;
        *(uint *)((long)&v0.field_0 + lVar16) = *(int *)(lVar5 + lVar18) * uVar17;
        *(uint *)((long)&v1.field_0 + lVar16) = *(int *)(lVar5 + 4 + lVar18) * uVar17;
        *(uint *)((long)local_48 + lVar16 + -0x10) = uVar17 * *(int *)(lVar5 + 8 + lVar18);
        uVar19 = uVar19 + 1;
      }
      else if (lVar16 != 0) {
        *(uint *)((long)&geomID.field_0 + lVar16) = geomID.field_0.i[0];
        *(undefined4 *)((long)local_48 + lVar16) = 0xffffffff;
        uVar6 = v0.field_0.i[0];
        *(uint *)((long)&v0.field_0 + lVar16) = v0.field_0.i[0];
        *(undefined4 *)((long)&v1.field_0 + lVar16) = uVar6;
        *(undefined4 *)((long)local_48 + lVar16 + -0x10) = uVar6;
      }
      if (uVar19 < uVar13) {
        pPVar15 = prims + uVar19;
      }
    }
    lVar14 = uVar8 * 0x50;
    *(longlong *)(pcVar9 + lVar14) = v0.field_0.v[0];
    *(longlong *)((long)(pcVar9 + lVar14) + 8) = v0.field_0.v[1];
    *(longlong *)(pcVar9 + lVar14 + 0x10) = v1.field_0.v[0];
    *(longlong *)((long)(pcVar9 + lVar14 + 0x10) + 8) = v1.field_0.v[1];
    *(longlong *)(pcVar9 + lVar14 + 0x20) = v2.field_0.v[0];
    *(longlong *)((long)(pcVar9 + lVar14 + 0x20) + 8) = v2.field_0.v[1];
    *(longlong *)(pcVar9 + lVar14 + 0x30) = geomID.field_0.v[0];
    *(longlong *)((long)(pcVar9 + lVar14 + 0x30) + 8) =
         CONCAT44(geomID.field_0.i[3],geomID.field_0.i[2]);
    *(ulong *)(pcVar9 + lVar14 + 0x40) = CONCAT44(local_48[1],local_48[0]);
    *(ulong *)(pcVar9 + lVar14 + 0x40 + 8) = CONCAT44(local_48[3],local_48[2]);
  }
  uVar8 = 7;
  if (uVar10 < 7) {
    uVar8 = uVar10;
  }
  return (NodeRefPtr<4>)(uVar8 | (ulong)pcVar9 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }